

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O3

DdNode ** Cudd_bddConstrainDecomp(DdManager *dd,DdNode *f)

{
  int *piVar1;
  size_t __size;
  DdNode *pDVar2;
  int iVar3;
  DdNode **decomp;
  long lVar4;
  
  iVar3 = dd->size;
  __size = (long)iVar3 * 8;
  decomp = (DdNode **)malloc(__size);
  if (decomp == (DdNode **)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    if (0 < iVar3) {
      memset(decomp,0,__size);
    }
    do {
      dd->reordered = 0;
      iVar3 = dd->size;
      if (0 < iVar3) {
        lVar4 = 0;
        do {
          if (decomp[lVar4] != (DdNode *)0x0) {
            Cudd_IterDerefBdd(dd,decomp[lVar4]);
            decomp[lVar4] = (DdNode *)0x0;
            iVar3 = dd->size;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < iVar3);
      }
      iVar3 = cuddBddConstrainDecomp(dd,f,decomp);
    } while (dd->reordered == 1);
    if (iVar3 != 0) {
      iVar3 = dd->size;
      if ((long)iVar3 < 1) {
        return decomp;
      }
      lVar4 = 0;
      do {
        if (decomp[lVar4] == (DdNode *)0x0) {
          pDVar2 = dd->one;
          decomp[lVar4] = pDVar2;
          piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
        }
        lVar4 = lVar4 + 1;
      } while (iVar3 != lVar4);
      return decomp;
    }
    free(decomp);
  }
  return (DdNode **)0x0;
}

Assistant:

DdNode **
Cudd_bddConstrainDecomp(
  DdManager * dd,
  DdNode * f)
{
    DdNode **decomp;
    int res;
    int i;

    /* Create an initialize decomposition array. */
    decomp = ABC_ALLOC(DdNode *,dd->size);
    if (decomp == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < dd->size; i++) {
        decomp[i] = NULL;
    }
    do {
        dd->reordered = 0;
        /* Clean up the decomposition array in case reordering took place. */
        for (i = 0; i < dd->size; i++) {
            if (decomp[i] != NULL) {
                Cudd_IterDerefBdd(dd, decomp[i]);
                decomp[i] = NULL;
            }
        }
        res = cuddBddConstrainDecomp(dd,f,decomp);
    } while (dd->reordered == 1);
    if (res == 0) {
        ABC_FREE(decomp);
        return(NULL);
    }
    /* Missing components are constant ones. */
    for (i = 0; i < dd->size; i++) {
        if (decomp[i] == NULL) {
            decomp[i] = DD_ONE(dd);
            cuddRef(decomp[i]);
        }
    }
    return(decomp);

}